

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tailqueue.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::tailqueue<libtorrent::aux::disk_job>::append
          (tailqueue<libtorrent::aux::disk_job> *this,tailqueue<libtorrent::aux::disk_job> *rhs)

{
  tailqueue<libtorrent::aux::disk_job> *rhs_local;
  tailqueue<libtorrent::aux::disk_job> *this_local;
  
  if (rhs->m_first != (disk_job *)0x0) {
    if (this->m_first == (disk_job *)0x0) {
      swap(this,rhs);
    }
    else {
      (this->m_last->super_tailqueue_node<libtorrent::aux::disk_job>).next = rhs->m_first;
      this->m_last = rhs->m_last;
      this->m_size = rhs->m_size + this->m_size;
    }
  }
  return;
}

Assistant:

void append(tailqueue<T> rhs) &
		{
			TORRENT_ASSERT(m_last == nullptr || m_last->next == nullptr);
			TORRENT_ASSERT(rhs.m_last == nullptr || rhs.m_last->next == nullptr);

			if (rhs.m_first == nullptr) return;

			if (m_first == nullptr)
			{
				swap(rhs);
				return;
			}

			m_last->next = rhs.m_first;
			m_last = rhs.m_last;
			m_size += rhs.m_size;

			TORRENT_ASSERT(m_last == nullptr || m_last->next == nullptr);
		}